

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void absl::lts_20240722::container_internal::SetCtrl
               (CommonFields *c,size_t i,ctrl_t h,size_t slot_size)

{
  ctrl_t *pcVar1;
  
  DoSanitizeOnSetCtrl(c,i,h,slot_size);
  pcVar1 = (c->heap_or_soo_).heap.control;
  pcVar1[i] = h;
  pcVar1[(ulong)((uint)c->capacity_ & 0xf) + (i - 0xf & c->capacity_)] = h;
  return;
}

Assistant:

inline void SetCtrl(const CommonFields& c, size_t i, ctrl_t h,
                    size_t slot_size) {
  DoSanitizeOnSetCtrl(c, i, h, slot_size);
  ctrl_t* ctrl = c.control();
  ctrl[i] = h;
  ctrl[((i - NumClonedBytes()) & c.capacity()) +
       (NumClonedBytes() & c.capacity())] = h;
}